

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_optimize.cc
# Opt level: O2

void __thiscall pass_inline_pass_param_Test::TestBody(pass_inline_pass_param_Test *this)

{
  bool bVar1;
  Generator *this_00;
  Generator *child;
  Port *this_01;
  Port *var;
  Var *pVVar2;
  Param *pPVar3;
  Expr *right;
  Var *this_02;
  Param *pPVar4;
  mapped_type *pmVar5;
  char *pcVar6;
  char *in_R9;
  undefined1 local_248 [8];
  Context ctx;
  undefined1 local_118 [8];
  shared_ptr<kratos::Attribute> attr;
  mapped_type src;
  key_type local_e0;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar_;
  undefined1 local_90 [8];
  VerilogModule vmod;
  
  kratos::Context::Context((Context *)local_248);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_90,"mod",(allocator<char> *)local_c0);
  this_00 = kratos::Context::generator((Context *)local_248,(string *)local_90);
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_90,"child",(allocator<char> *)local_c0);
  child = kratos::Context::generator((Context *)local_248,(string *)local_90);
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_90,"inst",(allocator<char> *)local_c0);
  kratos::Generator::add_child_generator(this_00,(string *)local_90,child);
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_90,"in1",(allocator<char> *)local_c0);
  this_01 = kratos::Generator::port(child,In,(string *)local_90,1);
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_90,"in2",(allocator<char> *)local_c0);
  var = kratos::Generator::port(child,In,(string *)local_90,1);
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_90,"v",(allocator<char> *)local_c0);
  pVVar2 = kratos::Generator::var(child,(string *)local_90,1);
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_90,"width",(allocator<char> *)local_c0);
  pPVar3 = kratos::Generator::parameter(child,(string *)local_90,0x20);
  std::__cxx11::string::~string((string *)local_90);
  (*(pPVar3->super_Const).super_Var.super_IRNode._vptr_IRNode[0x2b])(pPVar3,4);
  (*(this_01->super_Var).super_IRNode._vptr_IRNode[0x23])(this_01,pPVar3);
  (*(var->super_Var).super_IRNode._vptr_IRNode[0x23])(var,pPVar3);
  (*(pVVar2->super_IRNode)._vptr_IRNode[0x23])(pVVar2,pPVar3);
  right = kratos::Var::operator&(&this_01->super_Var,&var->super_Var);
  kratos::Generator::wire(child,pVVar2,&right->super_Var);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_90,"v1",(allocator<char> *)local_c0);
  ctx.tracked_generators_._M_h._M_single_bucket =
       (__node_base_ptr)
       kratos::Generator::var(this_00,(string *)local_90,(uint32_t)(pPVar3->super_Const).value_);
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_90,"v2",(allocator<char> *)local_c0);
  pVVar2 = kratos::Generator::var(this_00,(string *)local_90,(uint32_t)(pPVar3->super_Const).value_)
  ;
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_90,"param1",(allocator<char> *)local_c0);
  pPVar3 = kratos::Generator::parameter(child,(string *)local_90,0x20);
  std::__cxx11::string::~string((string *)local_90);
  (*(pPVar3->super_Const).super_Var.super_IRNode._vptr_IRNode[0x2b])(pPVar3,4);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_90,"v3",(allocator<char> *)local_c0);
  this_02 = kratos::Generator::var(child,(string *)local_90,2,1);
  std::__cxx11::string::~string((string *)local_90);
  kratos::Var::set_size_param(this_02,0,(Var *)pPVar3);
  (*(this_02->super_IRNode)._vptr_IRNode[0x23])(this_02,pPVar3);
  kratos::Generator::wire
            (this_00,&this_01->super_Var,(Var *)ctx.tracked_generators_._M_h._M_single_bucket);
  kratos::Generator::wire(this_00,&var->super_Var,pVVar2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_90,"p",(allocator<char> *)local_c0);
  pPVar4 = kratos::Generator::parameter(this_00,(string *)local_90,0x20);
  std::__cxx11::string::~string((string *)local_90);
  (*(pPVar4->super_Const).super_Var.super_IRNode._vptr_IRNode[0x2b])(pPVar4,4);
  kratos::Var::as<kratos::Param>((Var *)local_90);
  kratos::Param::set_value(pPVar3,(shared_ptr<kratos::Param> *)local_90);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&vmod);
  kratos::fix_assignment_type(this_00);
  kratos::verify_generator_connectivity(this_00);
  kratos::verify_assignments(this_00);
  std::make_shared<kratos::Attribute>();
  std::__cxx11::string::assign((char *)((long)local_118 + 0x28));
  std::vector<std::shared_ptr<kratos::Attribute>,std::allocator<std::shared_ptr<kratos::Attribute>>>
  ::emplace_back<std::shared_ptr<kratos::Attribute>const&>
            ((vector<std::shared_ptr<kratos::Attribute>,std::allocator<std::shared_ptr<kratos::Attribute>>>
              *)&(child->super_IRNode).attributes_,(shared_ptr<kratos::Attribute> *)local_118);
  kratos::inline_instance(this_00);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_90,"inst",
             (allocator<char> *)
             &attr.super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  bVar1 = kratos::Generator::has_child_generator(this_00,(string *)local_90);
  local_c0[0] = (allocator<char>)!bVar1;
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  std::__cxx11::string::~string((string *)local_90);
  if (local_c0[0] == (allocator<char>)0x0) {
    testing::Message::Message
              ((Message *)
               &attr.super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_90,(internal *)local_c0,
               (AssertionResult *)"mod.has_child_generator(\"inst\")","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_optimize.cc"
               ,0x212,(char *)local_90);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&local_e0,
               (Message *)
               &attr.super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e0);
    std::__cxx11::string::~string((string *)local_90);
    if (attr.super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      (*(attr.super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _vptr__Sp_counted_base[1])();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar_);
  kratos::VerilogModule::VerilogModule((VerilogModule *)local_90,this_00);
  kratos::VerilogModule::verilog_src_abi_cxx11_
            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_c0,(VerilogModule *)local_90);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,"mod",(allocator<char> *)&vmod.manager_.collect_perf_);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_c0,&local_e0);
  std::__cxx11::string::string
            ((string *)
             &attr.super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (string *)pmVar5);
  std::__cxx11::string::~string((string *)&local_e0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_c0);
  local_e0._M_dataplus._M_p =
       (pointer)std::__cxx11::string::find
                          ((char *)&attr.
                                    super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount,0x228a71);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_c0,"src.find(\"width\")","std::string::npos",
             (unsigned_long *)&local_e0,&std::__cxx11::string::npos);
  if (local_c0[0] == (allocator<char>)0x0) {
    testing::Message::Message((Message *)&local_e0);
    if (gtest_ar_._0_8_ == 0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)gtest_ar_._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&vmod.manager_.collect_perf_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_optimize.cc"
               ,0x216,pcVar6);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&vmod.manager_.collect_perf_,(Message *)&local_e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&vmod.manager_.collect_perf_);
    if ((long *)local_e0._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_e0._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar_);
  local_e0._M_dataplus._M_p =
       (pointer)std::__cxx11::string::find
                          ((char *)&attr.
                                    super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount,0x21fa55);
  testing::internal::CmpHelperNE<unsigned_long,unsigned_long>
            ((internal *)local_c0,"src.find(\"logic [p-1:0][p-1:0] v3;\")","std::string::npos",
             (unsigned_long *)&local_e0,&std::__cxx11::string::npos);
  if (local_c0[0] == (allocator<char>)0x0) {
    testing::Message::Message((Message *)&local_e0);
    if (gtest_ar_._0_8_ == 0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)gtest_ar_._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&vmod.manager_.collect_perf_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_optimize.cc"
               ,0x217,pcVar6);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&vmod.manager_.collect_perf_,(Message *)&local_e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&vmod.manager_.collect_perf_);
    if ((long *)local_e0._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_e0._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar_);
  std::__cxx11::string::~string
            ((string *)
             &attr.super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  kratos::PassManager::~PassManager((PassManager *)&vmod);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&attr);
  kratos::Context::~Context((Context *)local_248);
  return;
}

Assistant:

TEST(pass, inline_pass_param) {
    Context ctx;
    auto &mod = ctx.generator("mod");
    auto &child = ctx.generator("child");
    mod.add_child_generator("inst", child);
    auto &in1 = child.port(PortDirection::In, "in1", 1);
    auto &in2 = child.port(PortDirection::In, "in2", 1);
    auto &v = child.var("v", 1);
    auto &param = child.parameter("width", 32);
    param.set_value(4);
    in1.set_width_param(&param);
    in2.set_width_param(&param);
    v.set_width_param(&param);
    child.wire(v, in1 & in2);
    auto &v1 = mod.var("v1", param.value());
    auto &v2 = mod.var("v2", param.value());
    auto &param1 = child.parameter("param1", 32);
    param1.set_value(4);
    auto &v3 = child.var("v3", 2, 1);
    v3.set_size_param(0, &param1);
    v3.set_width_param(&param1);

    mod.wire(in1, v1);
    mod.wire(in2, v2);
    // will not be used
    auto &param1_ = mod.parameter("p", 32);
    param1_.set_value(4);
    param1.set_value(param1_.as<Param>());

    fix_assignment_type(&mod);
    verify_generator_connectivity(&mod);
    verify_assignments(&mod);

    auto attr = std::make_shared<Attribute>();
    attr->value_str = "inline";
    child.add_attribute(attr);

    inline_instance(&mod);

    EXPECT_FALSE(mod.has_child_generator("inst"));

    VerilogModule vmod(&mod);
    auto src = vmod.verilog_src()["mod"];
    EXPECT_EQ(src.find("width"), std::string::npos);
    EXPECT_NE(src.find("logic [p-1:0][p-1:0] v3;"), std::string::npos);
}